

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_DoTimerB(ym3438_t *chip)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  
  bVar1 = chip->timer_b_overflow;
  bVar3 = bVar1;
  if (chip->cycles == 2) {
    bVar3 = (chip->timer_b_load != '\0' && chip->timer_b_load_lock == '\0') | bVar1;
    chip->timer_b_load_lock = chip->timer_b_load;
  }
  uVar2 = *(ushort *)(chip->mode_test_21 + (ulong)(chip->timer_b_load_latch != '\0') * 4 + -0xd);
  chip->timer_b_load_latch = bVar3;
  bVar3 = (chip->cycles == 1) + chip->timer_b_subcnt;
  if (((bVar3 == 0x10) && (chip->timer_b_load_lock != '\0')) || (chip->mode_test_21[2] != '\0')) {
    uVar2 = uVar2 + 1;
  }
  chip->timer_b_subcnt = bVar3 & 0xf;
  if (chip->timer_b_reset == '\0') {
    chip->timer_b_overflow_flag = chip->timer_b_overflow_flag | bVar1 & chip->timer_b_enable;
  }
  else {
    chip->timer_b_reset = '\0';
    chip->timer_b_overflow_flag = '\0';
  }
  chip->timer_b_overflow = (Bit8u)(uVar2 >> 8);
  chip->timer_b_cnt = uVar2 & 0xff;
  return;
}

Assistant:

void OPN2_DoTimerB(ym3438_t *chip)
{
    Bit16u time;
    Bit8u load;
    load = chip->timer_b_overflow;
    if (chip->cycles == 2)
    {
        /* Lock load value */
        load |= (!chip->timer_b_load_lock && chip->timer_b_load);
        chip->timer_b_load_lock = chip->timer_b_load;
    }
    /* Load counter */
    if (chip->timer_b_load_latch)
    {
        time = chip->timer_b_reg;
    }
    else
    {
        time = chip->timer_b_cnt;
    }
    chip->timer_b_load_latch = load;
    /* Increase counter */
    if (chip->cycles == 1)
    {
        chip->timer_b_subcnt++;
    }
    if ((chip->timer_b_subcnt == 0x10 && chip->timer_b_load_lock) || chip->mode_test_21[2])
    {
        time++;
    }
    chip->timer_b_subcnt &= 0x0f;
    /* Set overflow flag */
    if (chip->timer_b_reset)
    {
        chip->timer_b_reset = 0;
        chip->timer_b_overflow_flag = 0;
    }
    else
    {
        chip->timer_b_overflow_flag |= chip->timer_b_overflow & chip->timer_b_enable;
    }
    chip->timer_b_overflow = (time >> 8);
    chip->timer_b_cnt = time & 0xff;
}